

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O1

int EVP_EncodeBlock(uchar *t,uchar *f,int n)

{
  byte bVar1;
  byte a;
  uint8_t uVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  
  if (CONCAT44(in_register_00000014,n) == 0) {
    lVar5 = 0;
  }
  else {
    uVar3 = CONCAT44(in_register_00000014,n);
    pbVar6 = f + 2;
    lVar5 = 0;
    do {
      uVar4 = (uint)pbVar6[-2] << 0x10;
      if (uVar3 < 3) {
        if (uVar3 == 2) {
          uVar4 = uVar4 | (uint)pbVar6[-1] << 8;
        }
        uVar2 = conv_bin2ascii((uint8_t)(uVar4 >> 0x12));
        t[lVar5] = uVar2;
        uVar2 = conv_bin2ascii((uint8_t)(uVar4 >> 0xc));
        t[lVar5 + 1] = uVar2;
        if (uVar3 == 1) {
          uVar2 = '=';
        }
        else {
          uVar2 = conv_bin2ascii((uint8_t)(uVar4 >> 6));
        }
        t[lVar5 + 2] = uVar2;
        t[lVar5 + 3] = '=';
        uVar3 = 0;
      }
      else {
        bVar1 = pbVar6[-1];
        a = *pbVar6;
        uVar2 = conv_bin2ascii(pbVar6[-2] >> 2);
        t[lVar5] = uVar2;
        uVar2 = conv_bin2ascii((uint8_t)(((uint)bVar1 * 0x100 | uVar4) >> 0xc));
        t[lVar5 + 1] = uVar2;
        uVar2 = conv_bin2ascii((uint8_t)((uint)a + (uint)bVar1 * 0x100 >> 6));
        t[lVar5 + 2] = uVar2;
        uVar2 = conv_bin2ascii(a);
        t[lVar5 + 3] = uVar2;
        uVar3 = uVar3 - 3;
      }
      lVar5 = lVar5 + 4;
      pbVar6 = pbVar6 + 3;
    } while (uVar3 != 0);
    t = t + lVar5;
  }
  *t = '\0';
  return (int)lVar5;
}

Assistant:

size_t EVP_EncodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  uint32_t l;
  size_t remaining = src_len, ret = 0;

  while (remaining) {
    if (remaining >= 3) {
      l = (((uint32_t)src[0]) << 16L) | (((uint32_t)src[1]) << 8L) | src[2];
      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = conv_bin2ascii(l >> 6L);
      *(dst++) = conv_bin2ascii(l);
      remaining -= 3;
    } else {
      l = ((uint32_t)src[0]) << 16L;
      if (remaining == 2) {
        l |= ((uint32_t)src[1] << 8L);
      }

      *(dst++) = conv_bin2ascii(l >> 18L);
      *(dst++) = conv_bin2ascii(l >> 12L);
      *(dst++) = (remaining == 1) ? '=' : conv_bin2ascii(l >> 6L);
      *(dst++) = '=';
      remaining = 0;
    }
    ret += 4;
    src += 3;
  }

  *dst = '\0';
  return ret;
}